

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O2

void __thiscall
oout::TestResult::TestResult(TestResult *this,shared_ptr<const_oout::Result> *result)

{
  (this->super_Result)._vptr_Result = (_func_int **)&PTR__TestResult_001cd900;
  std::__shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>,
             &result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

TestResult::TestResult(const shared_ptr<const Result> &result)
	: result(result)
{
}